

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall QWizardPrivate::updatePixmap(QWizardPrivate *this,WizardPixmap which)

{
  QWizard *this_00;
  QVBoxLayout *pQVar1;
  QWizardHeader *this_01;
  QLabel *pQVar2;
  bool bVar3;
  undefined4 uVar4;
  QWidget *pQVar5;
  QLayout *pQVar6;
  long *plVar7;
  ulong uVar8;
  QSpacerItem *this_02;
  Policy vPolicy;
  WizardPixmap which_00;
  long in_FS_OFFSET;
  QPixmap aQStack_e0 [24];
  QPixmap aQStack_c8 [24];
  undefined1 auStack_b0 [24];
  QArrayDataPointer<char16_t> QStack_98;
  undefined1 *puStack_78;
  undefined1 *puStack_70;
  undefined1 *puStack_68;
  undefined1 *puStack_60;
  undefined1 *puStack_58;
  undefined1 *puStack_50;
  undefined8 uStack_48;
  long lStack_38;
  
  if (which == BackgroundPixmap) {
    if (this->wizStyle != MacStyle) {
      return;
    }
    pQVar5 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
    QWidget::update(pQVar5);
    QWidget::updateGeometry(pQVar5);
    return;
  }
  lStack_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWizard **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  disableUpdates(this);
  uStack_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  layoutInfoForCurrentPage((QWizardLayoutInfo *)&puStack_78,this);
  bVar3 = QWizardLayoutInfo::operator!=(&this->layoutInfo,(QWizardLayoutInfo *)&puStack_78);
  if (bVar3) {
    recreateLayout(this,(QWizardLayoutInfo *)&puStack_78);
  }
  pQVar5 = &QWizard::currentPage(this_00)->super_QWidget;
  if (pQVar5 != (QWidget *)0x0) {
    pQVar6 = QWidget::layout(pQVar5);
    if (pQVar6 == (QLayout *)0x0) {
      vPolicy = Ignored;
    }
    else {
      pQVar1 = this->pageVBoxLayout;
      uVar4 = (**(code **)(*(long *)&(pQVar1->super_QBoxLayout).super_QLayout + 0xb8))
                        (pQVar1,pQVar5);
      plVar7 = (long *)(**(code **)(*(long *)&(pQVar1->super_QBoxLayout).super_QLayout + 0xa8))
                                 (pQVar1,uVar4);
      uVar8 = (**(code **)(*plVar7 + 0x28))(plVar7);
      vPolicy = Ignored;
      if ((uVar8 & 2) == 0) {
        vPolicy = MinimumExpanding;
      }
    }
    pQVar1 = this->pageVBoxLayout;
    (**(code **)(*(long *)&(pQVar1->super_QBoxLayout).super_QLayout + 200))(pQVar1);
    plVar7 = (long *)(**(code **)(*(long *)&(pQVar1->super_QBoxLayout).super_QLayout + 0xa8))
                               (pQVar1);
    this_02 = (QSpacerItem *)(**(code **)(*plVar7 + 0x78))(plVar7);
    QSpacerItem::changeSize(this_02,0,0,Ignored,vPolicy);
    (**(code **)(*(long *)&(this->pageVBoxLayout->super_QBoxLayout).super_QLayout + 0x70))();
  }
  which_00 = (WizardPixmap)pQVar5;
  if (uStack_48._0_1_ == true) {
    this_01 = this->headerWidget;
    QWizardPage::title((QString *)&QStack_98,(QWizardPage *)pQVar5);
    QWizardPage::subTitle((QString *)auStack_b0,(QWizardPage *)pQVar5);
    QWizardPage::pixmap((QWizardPage *)aQStack_c8,which_00);
    QWizardPage::pixmap((QWizardPage *)aQStack_e0,which_00);
    QWizardHeader::setup
              (this_01,(QWizardLayoutInfo *)&puStack_78,(QString *)&QStack_98,(QString *)auStack_b0,
               aQStack_c8,aQStack_e0,this->titleFmt,this->subTitleFmt);
    QPixmap::~QPixmap(aQStack_e0);
    QPixmap::~QPixmap(aQStack_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_98);
  }
  if ((uStack_48._1_1_ != false) || (uStack_48._5_1_ == true)) {
    QStack_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QStack_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QStack_98.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QPixmap::QPixmap((QPixmap *)&QStack_98);
    if (uStack_48._1_1_ == true) {
      if (pQVar5 == (QWidget *)0x0) {
        QPixmap::QPixmap((QPixmap *)auStack_b0,
                         (QPixmap *)
                         (*(long *)&(this_00->super_QDialog).super_QWidget.field_0x8 + 0x3c0));
      }
      else {
        QWizardPage::pixmap((QWizardPage *)auStack_b0,which_00);
      }
      QPixmap::operator=((QPixmap *)&QStack_98,(QPixmap *)auStack_b0);
      QPixmap::~QPixmap((QPixmap *)auStack_b0);
    }
    QLabel::setPixmap(&this->watermarkLabel->super_QLabel,(QPixmap *)&QStack_98);
    QPixmap::~QPixmap((QPixmap *)&QStack_98);
  }
  if (uStack_48._2_1_ == true) {
    QLabel::setTextFormat(this->titleLabel,this->titleFmt);
    pQVar2 = this->titleLabel;
    QWizardPage::title((QString *)&QStack_98,(QWizardPage *)pQVar5);
    QLabel::setText(pQVar2,(QString *)&QStack_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_98);
  }
  if (uStack_48._3_1_ == true) {
    QLabel::setTextFormat(this->subTitleLabel,this->subTitleFmt);
    pQVar2 = this->subTitleLabel;
    QWizardPage::subTitle((QString *)&QStack_98,(QWizardPage *)pQVar5);
    QLabel::setText(pQVar2,(QString *)&QStack_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_98);
  }
  enableUpdates(this);
  updateMinMaxSizes(this,(QWizardLayoutInfo *)&puStack_78);
  if (*(long *)(in_FS_OFFSET + 0x28) != lStack_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWizardPrivate::updatePixmap(QWizard::WizardPixmap which)
{
    Q_Q(QWizard);
    if (which == QWizard::BackgroundPixmap) {
        if (wizStyle == QWizard::MacStyle) {
            q->update();
            q->updateGeometry();
        }
    } else {
        updateLayout();
    }
}